

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digital_port_bits.cpp
# Opt level: O2

void __thiscall
ximu::DigitalPortBits::DigitalPortBits
          (DigitalPortBits *this,bool ax0,bool ax1,bool ax2,bool ax3,bool ax4,bool ax5,bool ax6,
          bool ax7)

{
  this->_data = ax7 << 7 | ax6 << 6 | ax5 << 5 | ax4 << 4 | ax3 << 3 | ax2 << 2 | ax1 * '\x02' | ax0
  ;
  return;
}

Assistant:

DigitalPortBits::DigitalPortBits(
    bool ax0, bool ax1, bool ax2, bool ax3,
    bool ax4, bool ax5, bool ax6, bool ax7) {
  set(ax0, 0);
  set(ax1, 1);
  set(ax2, 2);
  set(ax3, 3);
  set(ax4, 4);
  set(ax5, 5);
  set(ax6, 6);
  set(ax7, 7);
}